

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_> __thiscall
wabt::MakeUnique<wabt::ExceptionModuleField,wabt::Location>(wabt *this,Location *args)

{
  Location *loc;
  ExceptionModuleField *this_00;
  string_view local_28;
  Location *local_18;
  Location *args_local;
  
  local_18 = args;
  args_local = (Location *)this;
  this_00 = (ExceptionModuleField *)operator_new(0x78);
  loc = local_18;
  string_view::string_view(&local_28);
  ExceptionModuleField::ExceptionModuleField(this_00,loc,local_28);
  std::unique_ptr<wabt::ExceptionModuleField,std::default_delete<wabt::ExceptionModuleField>>::
  unique_ptr<std::default_delete<wabt::ExceptionModuleField>,void>
            ((unique_ptr<wabt::ExceptionModuleField,std::default_delete<wabt::ExceptionModuleField>>
              *)this,this_00);
  return (__uniq_ptr_data<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}